

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_utils.h
# Opt level: O1

unsigned_long
phmap::HashStateBase<unsigned_long>::combine<std::__cxx11::string,int>
          (unsigned_long seed,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          int *vs)

{
  size_t sVar1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_11,v);
  return (((sVar1 * -0x395b586ca42e166b ^ sVar1 * -0x395b586ca42e166b >> 0x2f) * -0x395b586ca42e166b
          ^ seed) * -0x395b586ca42e166b + 0xe6546b64 ^
         ((ulong)((long)*vs * -0x395b586ca42e166b) >> 0x2f ^ (long)*vs * -0x395b586ca42e166b) *
         -0x395b586ca42e166b) * -0x395b586ca42e166b + 0xe6546b64;
}

Assistant:

H HashStateBase<H>::combine(H seed, const T& v, const Ts&... vs)
{
    return HashStateBase<H>::combine(Combiner<H, sizeof(H)>()(
                                         seed, phmap::Hash<T>()(v)), 
                                     vs...);
}